

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O2

wchar_t archive_read_disk_set_behavior(archive *_a,wchar_t flags)

{
  byte *pbVar1;
  int iVar2;
  wchar_t wVar3;
  
  iVar2 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_honor_nodump");
  if (iVar2 == -0x1e) {
    wVar3 = L'\xffffffe2';
  }
  else {
    *(wchar_t *)&_a[1].error_string.s = flags;
    if ((flags & 1U) != 0) {
      wVar3 = archive_read_disk_set_atime_restored(_a);
      return wVar3;
    }
    wVar3 = L'\0';
    if (*(long *)&_a[1].archive_format != 0) {
      pbVar1 = (byte *)(*(long *)&_a[1].archive_format + 0x20);
      *pbVar1 = *pbVar1 & 0x7f;
    }
  }
  return wVar3;
}

Assistant:

int
archive_read_disk_set_behavior(struct archive *_a, int flags)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	int r = ARCHIVE_OK;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_read_disk_honor_nodump");

	a->flags = flags;

	if (flags & ARCHIVE_READDISK_RESTORE_ATIME)
		r = archive_read_disk_set_atime_restored(_a);
	else {
		if (a->tree != NULL)
			a->tree->flags &= ~needsRestoreTimes;
	}
	return (r);
}